

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::piece_picker::get_availability(piece_picker *this,vector<int,_piece_index_t> *avail)

{
  pointer ppVar1;
  int *piVar2;
  pointer ppVar3;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)avail,
             (long)(this->m_piece_map).
                   super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   .
                   super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_piece_map).
                   super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   .
                   super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  piVar2 = *(int **)avail;
  ppVar1 = (this->m_piece_map).
           super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->m_piece_map).
                super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                .
                super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    *piVar2 = (*(uint *)ppVar3 & 0x3ffffff) + this->m_seeds;
    piVar2 = piVar2 + 1;
  }
  return;
}

Assistant:

void piece_picker::get_availability(aux::vector<int, piece_index_t>& avail) const
	{
		TORRENT_ASSERT(m_seeds >= 0);
		INVARIANT_CHECK;

		avail.resize(m_piece_map.size());
		auto j = avail.begin();
		for (auto i = m_piece_map.begin(), end(m_piece_map.end()); i != end; ++i, ++j)
			*j = i->peer_count + m_seeds;
	}